

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O2

DdNode * cuddLocalCacheLookup(DdLocalCache *cache,DdNodePtr *key)

{
  unsigned_long *puVar1;
  uint keysize;
  uint uVar2;
  DdLocalCacheItem *__ptr;
  DdNode *pDVar3;
  long lVar4;
  _func_void_long *p_Var5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  DdLocalCacheItem *__s;
  DdNodePtr *key_00;
  undefined8 *puVar11;
  ulong uVar12;
  bool bVar13;
  double dVar14;
  
  dVar14 = cache->lookUps + 1.0;
  cache->lookUps = dVar14;
  keysize = cache->keysize;
  iVar9 = cache->shift;
  uVar6 = ddLCHash(key,keysize,iVar9);
  __ptr = cache->item;
  uVar2 = cache->itemsize;
  pDVar3 = *(DdNode **)((long)__ptr->key + ((ulong)(uVar6 * uVar2) - 8));
  if (pDVar3 != (DdNode *)0x0) {
    puVar11 = (undefined8 *)((long)__ptr->key + ((ulong)(uVar6 * uVar2) - 8));
    iVar7 = bcmp(key,puVar11 + 1,(ulong)keysize * 8);
    if (iVar7 == 0) {
      cache->hits = cache->hits + 1.0;
      if (((DdNode *)((ulong)pDVar3 & 0xfffffffffffffffe))->ref != 0) {
        return pDVar3;
      }
      cuddReclaim(cache->manager,(DdNode *)((ulong)pDVar3 & 0xfffffffffffffffe));
      return (DdNode *)*puVar11;
    }
  }
  uVar6 = cache->slots;
  uVar12 = (ulong)uVar6;
  if ((uVar6 < cache->maxslots) && (dVar14 * cache->minHit < cache->hits)) {
    uVar8 = uVar6 * 2;
    cache->slots = uVar8;
    p_Var5 = Extra_UtilMMoutOfMemory;
    __s = (DdLocalCacheItem *)malloc((ulong)(uVar8 * uVar2));
    cache->item = __s;
    Extra_UtilMMoutOfMemory = p_Var5;
    if (__s == (DdLocalCacheItem *)0x0) {
      cache->slots = uVar6;
      cache->item = __ptr;
      cache->maxslots = uVar6 - 1;
    }
    else {
      iVar9 = iVar9 + -1;
      cache->shift = iVar9;
      puVar1 = &cache->manager->memused;
      *puVar1 = *puVar1 + (ulong)(uVar6 * uVar2);
      uVar6 = 0;
      memset(__s,0,(ulong)(uVar8 * uVar2));
      while (bVar13 = uVar12 != 0, uVar12 = uVar12 - 1, bVar13) {
        lVar4 = *(long *)((long)__ptr->key + ((ulong)uVar6 - 8));
        if (lVar4 != 0) {
          key_00 = (DdNodePtr *)((long)__ptr->key + (ulong)uVar6);
          uVar10 = ddLCHash(key_00,keysize,iVar9);
          memcpy((void *)((long)__s->key + (ulong)(uVar10 * uVar2)),key_00,(ulong)keysize * 8);
          *(long *)((long)__s->key + ((ulong)(uVar10 * uVar2) - 8)) = lVar4;
        }
        uVar6 = uVar6 + uVar2;
      }
      free(__ptr);
      cache->lookUps = (double)(int)((double)uVar8 * cache->minHit + 1.0);
      cache->hits = 0.0;
    }
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddLocalCacheLookup(
  DdLocalCache * cache,
  DdNodePtr * key)
{
    unsigned int posn;
    DdLocalCacheItem *entry;
    DdNode *value;

    cache->lookUps++;
    posn = ddLCHash(key,cache->keysize,cache->shift);
    entry = (DdLocalCacheItem *) ((char *) cache->item +
                                  posn * cache->itemsize);
    if (entry->value != NULL &&
        memcmp(key,entry->key,cache->keysize*sizeof(DdNode *)) == 0) {
        cache->hits++;
        value = Cudd_Regular(entry->value);
        if (value->ref == 0) {
            cuddReclaim(cache->manager,value);
        }
        return(entry->value);
    }

    /* Cache miss: decide whether to resize */

    if (cache->slots < cache->maxslots &&
        cache->hits > cache->lookUps * cache->minHit) {
        cuddLocalCacheResize(cache);
    }

    return(NULL);

}